

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cFramebufferNoAttachmentsTests.cpp
# Opt level: O0

int __thiscall
glcts::FramebufferNoAttachmentsTests::init(FramebufferNoAttachmentsTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  FramebufferNoAttachmentsApiCase *this_00;
  FramebufferNoAttachmentsRenderCase *this_01;
  FramebufferNoAttachmentsTests *this_local;
  
  this_00 = (FramebufferNoAttachmentsApiCase *)operator_new(0x88);
  FramebufferNoAttachmentsApiCase::FramebufferNoAttachmentsApiCase
            (this_00,(this->super_TestCaseGroup).m_context,"api","Basic API verification");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (FramebufferNoAttachmentsRenderCase *)operator_new(0x90);
  FramebufferNoAttachmentsRenderCase::FramebufferNoAttachmentsRenderCase
            (this_01,(this->super_TestCaseGroup).m_context,"render","Rendering with imageStore");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  return extraout_EAX;
}

Assistant:

void FramebufferNoAttachmentsTests::init(void)
{
	addChild(new FramebufferNoAttachmentsApiCase(m_context, "api", "Basic API verification"));

	addChild(new FramebufferNoAttachmentsRenderCase(m_context, "render", "Rendering with imageStore"));
}